

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfFile.cpp
# Opt level: O0

bool __thiscall ElfSegment::isSectionPartOf(ElfSegment *this,ElfSection *section)

{
  Elf32_Off EVar1;
  Elf32_Word EVar2;
  Elf32_Off EVar3;
  Elf32_Word local_44;
  int segmentEnd;
  int segmentStart;
  int sectionEnd;
  int sectionSize;
  int sectionStart;
  ElfSection *section_local;
  ElfSegment *this_local;
  
  EVar1 = ElfSection::getOffset(section);
  EVar2 = ElfSection::getType(section);
  if (EVar2 == 8) {
    local_44 = 0;
  }
  else {
    local_44 = ElfSection::getSize(section);
  }
  EVar3 = (this->header).p_offset + (this->header).p_filesz;
  if (((int)EVar1 < (int)(this->header).p_offset) || ((int)EVar3 < (int)EVar1)) {
    this_local._7_1_ = false;
  }
  else if (EVar1 == EVar3) {
    this_local._7_1_ = local_44 == 0;
  }
  else if ((int)EVar3 < (int)(EVar1 + local_44)) {
    Logger::printError<>(Error,"Section partially contained in segment");
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ElfSegment::isSectionPartOf(ElfSection* section)
{
	int sectionStart = section->getOffset();
	int sectionSize = section->getType() == SHT_NOBITS ? 0 : section->getSize();
	int sectionEnd = sectionStart+sectionSize;

	int segmentStart = header.p_offset;
	int segmentEnd = segmentStart+header.p_filesz;

	// exclusive > in case the size is 0
	if (sectionStart < (int)header.p_offset || sectionStart > segmentEnd) return false;

	// does an empty section belong to this or the next segment? hm...
	if (sectionStart == segmentEnd) return sectionSize == 0;

	// the start is inside the section and the size is not 0, so the end should be in here too
	if (sectionEnd > segmentEnd)
	{
		Logger::printError(Logger::Error, "Section partially contained in segment");
		return false;
	}

	return true;
}